

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

uint64_t buffer_scroll(buffer_t *buffer,uint64_t offset,int width,int height)

{
  ulong local_40;
  int64_t scroll;
  uint64_t start;
  uint64_t middle;
  uint64_t rows;
  int height_local;
  int width_local;
  uint64_t offset_local;
  buffer_t *buffer_local;
  
  local_40 = (offset - offset % (ulong)(long)width) / (ulong)(long)width -
             ((ulong)(long)(height + -2) >> 1);
  if ((long)local_40 < 0) {
    local_40 = 0;
  }
  if ((buffer->size / (ulong)(long)width - (long)height) + 3 < local_40) {
    local_40 = (buffer->size / (ulong)(long)width - (long)height) + 3;
  }
  _height_local = offset;
  if (buffer->size - 1 < offset) {
    _height_local = buffer->size - 1;
  }
  buffer->cursor = _height_local;
  return local_40;
}

Assistant:

uint64_t
buffer_scroll(buffer_t *buffer, uint64_t offset, int width, int height)
{
    uint64_t rows = height - 2;
    uint64_t middle = rows / 2;

    uint64_t start = offset - (offset % width);
    int64_t scroll = start / width - middle;

    if (scroll < 0) {
        scroll = 0;
    }

    if (scroll > buffer->size / width - height + 3) {
        scroll = buffer->size / width - height + 3;
    }

    if (offset > buffer->size - 1) {
        offset = buffer->size - 1;
    }

    buffer->cursor = offset;
    return scroll;
}